

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_string_replace(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int is_replaceAll)

{
  JSValueUnion *pJVar1;
  JSValue JVar2;
  undefined1 auVar3 [16];
  JSValue JVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  int iVar8;
  JSValue *pJVar9;
  JSValueUnion JVar10;
  ulong extraout_RDX;
  ulong uVar11;
  JSValueUnion JVar12;
  JSValueUnion extraout_RDX_00;
  JSValueUnion extraout_RDX_01;
  JSValue *pJVar13;
  uint32_t to;
  int64_t iVar14;
  JSValueUnion JVar15;
  uint32_t from;
  JSValue JVar16;
  JSValue JVar17;
  JSValue v;
  JSValue v_00;
  JSValue JVar18;
  JSValue JVar19;
  JSValue JVar20;
  JSValue JVar21;
  JSValue JVar22;
  int64_t local_150;
  undefined4 local_148;
  undefined4 uStack_144;
  ulong local_138;
  JSValueUnion local_128;
  StringBuffer local_f0;
  ulong local_d0;
  JSValueUnion local_c8;
  JSValueUnion local_c0;
  JSValueUnion local_b8;
  long local_b0;
  JSValueUnion local_a8;
  JSValueUnion local_a0;
  JSValueUnion local_98;
  int64_t local_90;
  JSValueUnion local_88;
  int64_t local_80;
  JSValueUnion local_78;
  int64_t local_70;
  undefined4 local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_50;
  long local_48;
  int64_t local_40;
  
  if (((uint)this_val.tag & 0xfffffffe) == 2) {
    JS_ThrowTypeError(ctx,"cannot convert to object");
    local_a8.float64 = 0.0;
    goto LAB_0016b967;
  }
  uVar11 = (ulong)(uint)is_replaceAll;
  pJVar9 = (JSValue *)(argv->u).ptr;
  pJVar13 = (JSValue *)argv->tag;
  JVar21 = *argv;
  JVar22 = *argv;
  JVar18 = *argv;
  JVar20 = *argv;
  pJVar1 = &argv[1].u;
  JVar10 = *pJVar1;
  iVar14 = argv[1].tag;
  JVar17 = *(JSValue *)pJVar1;
  JVar4 = *(JSValue *)pJVar1;
  JVar16 = *(JSValue *)pJVar1;
  local_148 = 0;
  uVar7 = (uint)pJVar13 & 0xfffffffe;
  JVar19.u._4_4_ = 0;
  JVar19.u.int32 = uVar7;
  JVar19.tag = this_val.tag;
  if (uVar7 != 2) {
    if (is_replaceAll == 0) {
LAB_0016b9c7:
      argv = pJVar9;
      JVar19 = JS_GetPropertyInternal(ctx,JVar20,0xc9,JVar18,0);
      iVar8 = (int)JVar19.tag;
      if ((iVar8 == 2) || (iVar8 == 3)) {
        bVar5 = true;
      }
      else {
        if (iVar8 == 6) goto LAB_0016ba05;
        local_98 = this_val.u;
        local_90 = this_val.tag;
        local_88 = JVar10;
        local_80 = iVar14;
        JVar19 = JS_CallFree(ctx,JVar19,JVar22,2,(JSValue *)&local_98);
        uVar11 = JVar19.tag;
        bVar5 = false;
        argv = pJVar13;
      }
    }
    else {
      iVar8 = check_regexp_g_flag(ctx,*argv);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = extraout_RDX;
      JVar19 = (JSValue)(auVar6 << 0x40);
      if (-1 < iVar8) goto LAB_0016b9c7;
LAB_0016ba05:
      uVar11 = 6;
      bVar5 = false;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = JVar19.tag;
      JVar19 = (JSValue)(auVar3 << 0x40);
    }
    JVar20.tag = uVar11;
    JVar20.u.float64 = JVar19.u.float64;
    if (!bVar5) {
      return JVar20;
    }
  }
  local_a8 = JVar19.u;
  local_f0.len = 0;
  local_f0.size = 0;
  local_f0.is_wide_char = 0;
  local_f0.error_status = 0;
  local_f0.ctx = ctx;
  local_f0.str = js_alloc_string(ctx,0,0);
  if (local_f0.str == (JSString *)0x0) {
    local_f0._16_8_ = local_f0._16_8_ & 0xffffffff;
    local_f0.error_status = -1;
  }
  JVar20 = JS_ToStringInternal(ctx,this_val,0);
  JVar18.tag = JVar20.tag;
  JVar10 = JVar20.u;
  JVar19 = (JSValue)(ZEXT816(3) << 0x40);
  if ((uint)JVar20.tag == 6) {
    iVar14 = 3;
    JVar22 = JVar20;
  }
  else {
    JVar19 = (JSValue)(ZEXT816(3) << 0x40);
    JVar21 = JS_ToStringInternal(ctx,JVar21,0);
    iVar14 = JVar21.tag;
    JVar22.tag = iVar14;
    JVar22.u.float64 = JVar10.float64;
    local_148 = JVar21.u._0_4_;
    uStack_144 = JVar21.u._4_4_;
    if ((int)JVar21.tag != 6) {
      iVar8 = JS_IsFunction(ctx,JVar16);
      pJVar9 = (JSValue *)0x3;
      JVar19 = (JSValue)(ZEXT816(3) << 0x40);
      if (iVar8 != 0) {
LAB_0016bb6b:
        local_d0 = (ulong)JVar19.u.ptr & 0xffffffff;
        local_b0 = ((long)pJVar9 << 0x20) + local_d0;
        bVar5 = false;
        from = 0;
        JVar12 = JVar10;
        local_c8 = JVar10;
        local_c0 = JVar21.u;
        local_b8 = JVar10;
        local_a0 = JVar21.u;
        do {
          uVar11 = local_138;
          local_150 = JVar19.tag;
          if ((*(uint *)((long)local_a0.ptr + 4) & 0x7fffffff) == 0) {
            JVar15.float64 = 0.0;
            if ((bVar5) &&
               (JVar15._4_4_ = 0, JVar15.int32 = from + 1,
               (int)(*(uint *)((long)JVar10.ptr + 4) & 0x7fffffff) <= (int)from)) {
              JVar15.float64 = 2.12199579047121e-314;
            }
          }
          else {
            uVar7 = string_indexof((JSString *)JVar10.ptr,(JSString *)local_a0.ptr,from);
            JVar15._4_4_ = 0;
            JVar15.int32 = uVar7;
            JVar12 = extraout_RDX_00;
          }
          to = JVar15.int32;
          if ((int)to < 0) {
            if (!bVar5) {
              (*((local_f0.ctx)->rt->mf).js_free)(&(local_f0.ctx)->rt->malloc_state,local_f0.str);
              local_f0.str = (JSString *)0x0;
              JS_FreeValue(ctx,JVar21);
              JVar21.u.ptr = (void *)(local_d0 | (long)pJVar9 << 0x20);
              JVar21.tag = local_150;
              JS_FreeValue(ctx,JVar21);
              return JVar20;
            }
            break;
          }
          local_90 = iVar14;
          if (iVar8 == 0) {
            local_98.float64 = local_c0.float64;
            local_88.float64 = local_c8.float64;
            local_70 = 0;
            local_68 = 0;
            local_60 = 3;
            local_58 = 0;
            local_50 = 3;
            local_48 = local_b0;
            local_40 = local_150;
            JVar16.tag = (int64_t)JVar12.ptr;
            JVar16.u.ptr = &local_98;
            local_80 = JVar18.tag;
            local_78 = JVar15;
            JVar22 = js_string___GetSubstitution(ctx,JVar16,3,argv);
          }
          else {
            local_98.float64 = local_c0.float64;
            local_80 = 0;
            local_78.float64 = local_c8.float64;
            local_138 = local_138 & 0xffffffff00000000;
            JVar4.tag = 3;
            JVar4.u.ptr = (void *)(uVar11 & 0xffffffff00000000);
            argv = (JSValue *)0x3;
            local_88 = JVar15;
            local_70 = JVar18.tag;
            JVar22 = JS_CallInternal(ctx,JVar17,(JSValue)(ZEXT816(3) << 0x40),JVar4,3,
                                     (JSValue *)&local_98,2);
            JVar22 = JS_ToStringFree(ctx,JVar22);
          }
          if ((int)JVar22.tag == 6) {
            JVar22.tag = JVar22.tag;
            JVar22.u.float64 = local_b8.float64;
            goto LAB_0016be8c;
          }
          string_buffer_concat(&local_f0,(JSString *)JVar10.ptr,from,to);
          string_buffer_concat_value_free(&local_f0,JVar22);
          from = (*(uint *)((long)local_a0.ptr + 4) & 0x7fffffff) + to;
          bVar5 = true;
          JVar12 = extraout_RDX_01;
        } while (is_replaceAll != 0);
        string_buffer_concat
                  (&local_f0,(JSString *)JVar10.ptr,from,
                   *(uint *)((long)JVar10.ptr + 4) & 0x7fffffff);
        JS_FreeValue(ctx,JVar21);
        JVar17.u.ptr = (void *)(local_d0 | (long)pJVar9 << 0x20);
        JVar17.tag = local_150;
        JS_FreeValue(ctx,JVar17);
        JS_FreeValue(ctx,JVar20);
        JVar19 = string_buffer_end(&local_f0);
        return JVar19;
      }
      JVar19 = JS_ToStringInternal(ctx,JVar4,0);
      JVar22.tag = JVar19.tag;
      pJVar9 = (JSValue *)((ulong)JVar19.u.ptr >> 0x20);
      if ((int)JVar19.tag != 6) goto LAB_0016bb6b;
    }
  }
LAB_0016be8c:
  local_128 = JVar19.u;
  JVar12 = JVar22.u;
  (*((local_f0.ctx)->rt->mf).js_free)(&(local_f0.ctx)->rt->malloc_state,local_f0.str);
  local_f0.str = (JSString *)0x0;
  JVar10._4_4_ = uStack_144;
  JVar10.int32 = local_148;
  if ((0xfffffff4 < (uint)iVar14) &&
     (iVar8 = *JVar10.ptr, *(int *)JVar10.ptr = iVar8 + -1, iVar8 < 2)) {
    v.tag = iVar14;
    v.u.ptr = JVar10.ptr;
    __JS_FreeValueRT(ctx->rt,v);
  }
  JVar10.ptr = (void *)((ulong)local_128.ptr & 0xffffffff | (long)pJVar9 << 0x20);
  if ((0xfffffff4 < (uint)JVar19.tag) &&
     (iVar8 = *JVar10.ptr, *(int *)JVar10.ptr = iVar8 + -1, iVar8 < 2)) {
    v_00.tag = JVar19.tag;
    v_00.u.ptr = JVar10.ptr;
    __JS_FreeValueRT(ctx->rt,v_00);
  }
  if ((0xfffffff4 < (uint)JVar20.tag) &&
     (iVar8 = *JVar12.ptr, *(int *)JVar12.ptr = iVar8 + -1, iVar8 < 2)) {
    JVar18.u.ptr = JVar12.ptr;
    __JS_FreeValueRT(ctx->rt,JVar18);
  }
  local_a8.float64 = local_a8.float64 & 0xffffffff00000000;
LAB_0016b967:
  JVar2.tag = 6;
  JVar2.u.float64 = local_a8.float64;
  return JVar2;
}

Assistant:

static JSValue js_string_replace(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv,
                                 int is_replaceAll)
{
    // replace(rx, rep)
    JSValueConst O = this_val, searchValue = argv[0], replaceValue = argv[1];
    JSValueConst args[6];
    JSValue str, search_str, replaceValue_str, repl_str;
    JSString *sp, *searchp;
    StringBuffer b_s, *b = &b_s;
    int pos, functionalReplace, endOfLastMatch;
    BOOL is_first;

    if (JS_IsUndefined(O) || JS_IsNull(O))
        return JS_ThrowTypeError(ctx, "cannot convert to object");

    search_str = JS_UNDEFINED;
    replaceValue_str = JS_UNDEFINED;
    repl_str = JS_UNDEFINED;

    if (!JS_IsUndefined(searchValue) && !JS_IsNull(searchValue)) {
        JSValue replacer;
        if (is_replaceAll) {
            if (check_regexp_g_flag(ctx, searchValue) < 0)
                return JS_EXCEPTION;
        }
        replacer = JS_GetProperty(ctx, searchValue, JS_ATOM_Symbol_replace);
        if (JS_IsException(replacer))
            return JS_EXCEPTION;
        if (!JS_IsUndefined(replacer) && !JS_IsNull(replacer)) {
            args[0] = O;
            args[1] = replaceValue;
            return JS_CallFree(ctx, replacer, searchValue, 2, args);
        }
    }
    string_buffer_init(ctx, b, 0);

    str = JS_ToString(ctx, O);
    if (JS_IsException(str))
        goto exception;
    search_str = JS_ToString(ctx, searchValue);
    if (JS_IsException(search_str))
        goto exception;
    functionalReplace = JS_IsFunction(ctx, replaceValue);
    if (!functionalReplace) {
        replaceValue_str = JS_ToString(ctx, replaceValue);
        if (JS_IsException(replaceValue_str))
            goto exception;
    }

    sp = JS_VALUE_GET_STRING(str);
    searchp = JS_VALUE_GET_STRING(search_str);
    endOfLastMatch = 0;
    is_first = TRUE;
    for(;;) {
        if (unlikely(searchp->len == 0)) {
            if (is_first)
                pos = 0;
            else if (endOfLastMatch >= sp->len)
                pos = -1;
            else
                pos = endOfLastMatch + 1;
        } else {
            pos = string_indexof(sp, searchp, endOfLastMatch);
        }
        if (pos < 0) {
            if (is_first) {
                string_buffer_free(b);
                JS_FreeValue(ctx, search_str);
                JS_FreeValue(ctx, replaceValue_str);
                return str;
            } else {
                break;
            }
        }
        if (functionalReplace) {
            args[0] = search_str;
            args[1] = JS_NewInt32(ctx, pos);
            args[2] = str;
            repl_str = JS_ToStringFree(ctx, JS_Call(ctx, replaceValue, JS_UNDEFINED, 3, args));
        } else {
            args[0] = search_str;
            args[1] = str;
            args[2] = JS_NewInt32(ctx, pos);
            args[3] = JS_UNDEFINED;
            args[4] = JS_UNDEFINED;
            args[5] = replaceValue_str;
            repl_str = js_string___GetSubstitution(ctx, JS_UNDEFINED, 6, args);
        }
        if (JS_IsException(repl_str))
            goto exception;
        
        string_buffer_concat(b, sp, endOfLastMatch, pos);
        string_buffer_concat_value_free(b, repl_str);
        endOfLastMatch = pos + searchp->len;
        is_first = FALSE;
        if (!is_replaceAll)
            break;
    }
    string_buffer_concat(b, sp, endOfLastMatch, sp->len);
    JS_FreeValue(ctx, search_str);
    JS_FreeValue(ctx, replaceValue_str);
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);

exception:
    string_buffer_free(b);
    JS_FreeValue(ctx, search_str);
    JS_FreeValue(ctx, replaceValue_str);
    JS_FreeValue(ctx, str);
    return JS_EXCEPTION;
}